

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlistview.cpp
# Opt level: O3

void QListView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte *pbVar1;
  undefined1 *puVar2;
  QFlagsStorage<Qt::AlignmentFlag> QVar3;
  QFlagsStorage<Qt::AlignmentFlag> *pQVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined1 uVar7;
  undefined4 uVar8;
  InterfaceType *pIVar9;
  QAbstractItemViewPrivate *this;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    uStack_40 = SUB84(_a[1],0);
    uStack_3c = (undefined4)((ulong)_a[1] >> 0x20);
    QMetaObject::activate(_o,&staticMetaObject,0,(void **)&local_48);
  }
  switch(_c) {
  case ReadProperty:
    if (0xd < (uint)_id) goto switchD_00574cc9_caseD_3;
    puVar6 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x55c);
      break;
    case 1:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x558);
      break;
    case 2:
      uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x548);
      goto LAB_00574e19;
    case 3:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x560);
      break;
    case 4:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x564);
      break;
    case 5:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x54c);
      break;
    case 6:
      pIVar9 = *(InterfaceType **)(*(long *)(_o + 8) + 0x550);
LAB_00574ec4:
      *puVar6 = pIVar9;
      goto switchD_00574cc9_caseD_3;
    case 7:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x568);
      break;
    case 8:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x590);
      break;
    case 9:
      uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x594);
      goto LAB_00574e19;
    case 10:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x5a0);
      break;
    case 0xb:
      uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x491);
      goto LAB_00574e19;
    case 0xc:
      uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x5b4);
LAB_00574e19:
      *(undefined1 *)puVar6 = uVar7;
      goto switchD_00574cc9_caseD_3;
    case 0xd:
      uVar8 = *(undefined4 *)(*(long *)(_o + 8) + 0x5b8);
    }
    *(undefined4 *)puVar6 = uVar8;
    goto switchD_00574cc9_caseD_3;
  case WriteProperty:
    if (0xd < (uint)_id) goto switchD_00574cc9_caseD_3;
    break;
  default:
    goto switchD_00574cc9_caseD_3;
  case IndexOfMethod:
    if ((*_a[1] == indexesMoved) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    goto switchD_00574cc9_caseD_3;
  case RegisterMethodArgumentMetaType:
    if (_id == 0) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar9 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType;
        goto LAB_00574ec4;
      }
    }
    else {
      puVar6 = (undefined8 *)*_a;
    }
    *puVar6 = 0;
    goto switchD_00574cc9_caseD_3;
  }
  pQVar4 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
  switch(_id) {
  case 0:
    setMovement((QListView *)_o,pQVar4->i);
    break;
  case 1:
    QVar3.i = pQVar4->i;
    this = *(QAbstractItemViewPrivate **)(_o + 8);
    puVar2 = &this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x2c;
    *puVar2 = *puVar2 | 8;
    *(Int *)&this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
             field_0x18 = QVar3.i;
    goto LAB_00574f19;
  case 2:
    uVar7 = *(undefined1 *)&pQVar4->i;
    this = *(QAbstractItemViewPrivate **)(_o + 8);
    puVar2 = &this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x2c;
    *puVar2 = *puVar2 | 1;
    this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8 =
         uVar7;
    goto LAB_00574f19;
  case 3:
    QVar3.i = pQVar4->i;
    lVar5 = *(long *)(_o + 8);
    pbVar1 = (byte *)(lVar5 + 0x56c);
    *pbVar1 = *pbVar1 | 0x20;
    *(Int *)(lVar5 + 0x560) = QVar3.i;
    break;
  case 4:
    *(Int *)(*(long *)(_o + 8) + 0x564) = pQVar4->i;
    break;
  case 5:
    QVar3.i = pQVar4->i;
    this = *(QAbstractItemViewPrivate **)(_o + 8);
    puVar2 = &this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x2c;
    *puVar2 = *puVar2 | 2;
    *(Int *)&this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
             field_0xc = QVar3.i;
    goto LAB_00574f19;
  case 6:
    this = *(QAbstractItemViewPrivate **)(_o + 8);
    puVar2 = &this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
              field_0x2c;
    *puVar2 = *puVar2 | 4;
    *(undefined8 *)
     &this[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x10 =
         *(undefined8 *)pQVar4;
    goto LAB_00574f19;
  case 7:
    setViewMode((QListView *)_o,pQVar4->i);
    break;
  case 8:
    setModelColumn((QListView *)_o,pQVar4->i);
    break;
  case 9:
    *(undefined1 *)(*(long *)(_o + 8) + 0x594) = *(undefined1 *)&pQVar4->i;
    break;
  case 10:
    if ((int)pQVar4->i < 1) {
      local_48._0_4_ = 2;
      local_48._4_4_ = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      uStack_38 = 0;
      local_34 = 0;
      local_30 = "default";
      QMessageLogger::warning((char *)&local_48,"Invalid batchSize (%d)");
    }
    else {
      *(Int *)(*(long *)(_o + 8) + 0x5a0) = pQVar4->i;
    }
    break;
  case 0xb:
    this = *(QAbstractItemViewPrivate **)(_o + 8);
    if (this->wrapItemText == *(bool *)&pQVar4->i) break;
    this->wrapItemText = *(bool *)&pQVar4->i;
LAB_00574f19:
    QAbstractItemViewPrivate::doDelayedItemsLayout(this,0);
    break;
  case 0xc:
    uVar7 = *(undefined1 *)&pQVar4->i;
    lVar5 = *(long *)(_o + 8);
    pbVar1 = (byte *)(lVar5 + 0x56c);
    *pbVar1 = *pbVar1 | 0x40;
    *(undefined1 *)(lVar5 + 0x5b4) = uVar7;
    break;
  case 0xd:
    setItemAlignment((QListView *)_o,(Alignment)pQVar4->i);
  }
switchD_00574cc9_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QListView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->indexesMoved((*reinterpret_cast< std::add_pointer_t<QModelIndexList>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QModelIndexList >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QListView::*)(const QModelIndexList & )>(_a, &QListView::indexesMoved, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Movement*>(_v) = _t->movement(); break;
        case 1: *reinterpret_cast<Flow*>(_v) = _t->flow(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isWrapping(); break;
        case 3: *reinterpret_cast<ResizeMode*>(_v) = _t->resizeMode(); break;
        case 4: *reinterpret_cast<LayoutMode*>(_v) = _t->layoutMode(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->spacing(); break;
        case 6: *reinterpret_cast<QSize*>(_v) = _t->gridSize(); break;
        case 7: *reinterpret_cast<ViewMode*>(_v) = _t->viewMode(); break;
        case 8: *reinterpret_cast<int*>(_v) = _t->modelColumn(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->uniformItemSizes(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->batchSize(); break;
        case 11: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->isSelectionRectVisible(); break;
        case 13: *reinterpret_cast<Qt::Alignment*>(_v) = _t->itemAlignment(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMovement(*reinterpret_cast<Movement*>(_v)); break;
        case 1: _t->setFlow(*reinterpret_cast<Flow*>(_v)); break;
        case 2: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setResizeMode(*reinterpret_cast<ResizeMode*>(_v)); break;
        case 4: _t->setLayoutMode(*reinterpret_cast<LayoutMode*>(_v)); break;
        case 5: _t->setSpacing(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setGridSize(*reinterpret_cast<QSize*>(_v)); break;
        case 7: _t->setViewMode(*reinterpret_cast<ViewMode*>(_v)); break;
        case 8: _t->setModelColumn(*reinterpret_cast<int*>(_v)); break;
        case 9: _t->setUniformItemSizes(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setBatchSize(*reinterpret_cast<int*>(_v)); break;
        case 11: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 12: _t->setSelectionRectVisible(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setItemAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        default: break;
        }
    }
}